

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.hpp
# Opt level: O0

bool pstore::http::
     check_message_complete<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
               (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                *sender,reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                        io,frame *wsp,opcode *op,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *payload)

{
  uint uVar1;
  frame *this;
  bool bVar2;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> io_00;
  span<const_unsigned_char,__1L> *in_R9;
  error_code eVar3;
  byte local_e5;
  error_code local_d8;
  undefined1 local_c8 [48];
  span<unsigned_char_const,_1l> local_98 [16];
  _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
  *local_88;
  undefined1 local_80 [8];
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  eo3;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_60;
  uchar *local_48;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *payload_local;
  opcode *op_local;
  frame *wsp_local;
  _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
  *sender_local;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> io_local
  ;
  
  if ((wsp->fin & 1U) != 0) {
    local_e5 = 0;
    local_38 = payload;
    payload_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)op;
    op_local = &wsp->op;
    wsp_local = (frame *)sender;
    sender_local = (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                    *)io._M_data;
    if (*op == text) {
      local_40._M_current =
           (uchar *)std::begin<std::vector<unsigned_char,std::allocator<unsigned_char>>>(payload);
      local_48 = (uchar *)std::end<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                    (local_38);
      bVar2 = is_valid_utf8<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        (local_40,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                   )local_48);
      local_e5 = bVar2 ^ 0xff;
    }
    this = wsp_local;
    if ((local_e5 & 1) != 0) {
      eo3._16_8_ = sender_local;
      send_close_frame<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                (&local_60,(http *)wsp_local,sender_local,
                 (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  )0x3ef,(close_status_code)payload);
      error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
      ::~error_or(&local_60);
      return false;
    }
    local_88 = sender_local;
    uVar1 = *(uint *)&(payload_local->
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                      super__Vector_impl_data._M_start;
    local_c8._32_16_ =
         (undefined1  [16])
         pstore::gsl::make_span<std::vector<unsigned_char,std::allocator<unsigned_char>>>(local_38);
    pstore::gsl::span<unsigned_char_const,-1l>::span<unsigned_char,_1l>
              (local_98,(span<unsigned_char,__1L> *)(local_c8 + 0x20));
    io_00._M_data._4_4_ = 0;
    io_00._M_data._0_4_ = uVar1;
    send_message<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              ((error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
                *)local_80,(http *)this,local_88,io_00,(opcode)local_98,in_R9);
    bVar2 = pstore::error_or::operator_cast_to_bool((error_or *)local_80);
    if (!bVar2) {
      eVar3 = error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
              ::get_error((error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
                           *)local_80);
      local_d8._M_cat = eVar3._M_cat;
      local_d8._M_value = eVar3._M_value;
      std::error_code::message_abi_cxx11_((string *)local_c8,&local_d8);
      log<std::__cxx11::string>
                (error,"Send error: ",
                 (_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<pstore::gsl::not_null<pstore::brokerface::channel<pstore::descriptor_condition_variable>_*>,_pstore::gsl::not_null<pstore::descriptor_condition_variable_*>_>_>,_true>
                  *)local_c8);
      std::__cxx11::string::~string((string *)local_c8);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(local_38);
    *(undefined4 *)
     &(payload_local->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start = 0xff;
    error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
    ::~error_or((error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
                 *)local_80);
  }
  return true;
}

Assistant:

bool check_message_complete (Sender const sender, IO const io, frame const & wsp,
                                     opcode & op, std::vector<std::uint8_t> & payload) {
            if (wsp.fin) {
                // We've got the complete message. If this was a text message, we need to
                // validate the UTF-8 that it contains.
                //
                // "When an endpoint is to interpret a byte stream as UTF-8 but finds that
                // the byte stream is not, in fact, a valid UTF-8 stream, that endpoint MUST
                // _Fail the WebSocket Connection_.
                if (op == opcode::text &&
                    !is_valid_utf8 (std::begin (payload), std::end (payload))) {

                    send_close_frame (sender, io, close_status_code::invalid_payload);
                    return false;
                }

                if (log_received_messages) {
                    std::string str;
                    std::transform (std::begin (payload), std::end (payload),
                                    std::back_inserter (str),
                                    [] (std::uint8_t const v) { return static_cast<char> (v); });
                    log (logger::priority::info, "Received: ", str);
                }

                // This implements a simple echo server ATM.
                error_or<IO> const eo3 = send_message (sender, io, op, gsl::make_span (payload));
                if (!eo3) {
                    log (logger::priority::error, "Send error: ", eo3.get_error ().message ());
                }

                payload.clear ();
                op = opcode::unknown;
            }
            return true;
        }